

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void mp::internal::FormatRST(Writer *w,CStringRef s,int indent,ValueArrayRef values)

{
  ValueArrayRef values_00;
  OptionValueInfo *in_RCX;
  undefined4 in_R8D;
  Parser parser;
  RSTFormatter formatter;
  RSTFormatter *this;
  int in_stack_ffffffffffffff34;
  Writer *in_stack_ffffffffffffff38;
  RSTFormatter *in_stack_ffffffffffffff40;
  _Map_pointer in_stack_ffffffffffffff78;
  Parser *in_stack_ffffffffffffff80;
  undefined4 uStack_c;
  BasicCStringRef<char> local_8;
  
  values_00._12_4_ = uStack_c;
  values_00.size_ = in_R8D;
  this = (RSTFormatter *)&stack0xffffffffffffff58;
  values_00.values_ = in_RCX;
  anon_unknown.dwarf_1f2d20::RSTFormatter::RSTFormatter
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,values_00,in_stack_ffffffffffffff34
            );
  rst::Parser::Parser((Parser *)&stack0xffffffffffffff38,&this->super_ContentHandler);
  fmt::BasicCStringRef<char>::c_str(&local_8);
  rst::Parser::Parse(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  anon_unknown.dwarf_1f2d20::RSTFormatter::~RSTFormatter(this);
  return;
}

Assistant:

void FormatRST(fmt::Writer &w,
    fmt::CStringRef s, int indent, ValueArrayRef values) {
  RSTFormatter formatter(w, values, indent);
  rst::Parser parser(&formatter);
  parser.Parse(s.c_str());
}